

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseTopOrGroup
          (StructTranslator *this,Reader members,MemberInfo *parent,StructOrGroup *layout)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  short sVar2;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar3;
  MemberInfo **ppMVar4;
  Reader parent_00;
  Reader parent_01;
  Reader members_00;
  Reader members_01;
  Reader decl;
  Reader decl_00;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar5;
  MemberInfo **ppMVar6;
  MemberInfo *parent_02;
  uint *codeOrder_00;
  size_t sVar7;
  ListElementCount LVar8;
  ElementCount index;
  MemberInfo *pMVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Reader RVar12;
  uint codeOrder;
  uint independentSubCodeOrder;
  Reader member;
  uint local_1e4;
  bool local_1dd;
  uint local_1dc;
  PointerReader local_1d8;
  StructReader local_1b8;
  Arena *local_180;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_178;
  MemberInfo *local_170;
  StructOrGroup *local_168;
  ElementCount local_15c;
  StructBuilder *local_158;
  Union *local_150;
  NodeSourceInfoBuilderPair local_148;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_f8;
  ListReader local_f0;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ListReader local_90;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1e4 = 0;
  if (members.reader.elementCount != 0) {
    local_180 = &this->arena;
    local_158 = &(parent->node)._builder;
    local_178 = &this->allMembers;
    local_f8 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)&this->membersByOrdinal;
    index = 0;
    local_15c = members.reader.elementCount;
    LVar8 = members.reader.elementCount;
    local_170 = parent;
    local_168 = layout;
    do {
      capnp::_::ListReader::getStructElement(&local_1b8,&members.reader,index);
      pMVar9 = parent;
      if (0x1f < local_1b8.dataSize) {
        sVar2 = *(short *)((long)local_1b8.data + 2);
        if (sVar2 == 8) {
          parent->childCount = parent->childCount + 1;
          local_1d8.segment._0_4_ = local_1e4;
          local_1e4 = local_1e4 + 1;
          capnp::_::StructBuilder::asReader(local_158);
          decl_00._reader.segment._4_4_ = local_1b8.segment._4_4_;
          decl_00._reader.segment._0_4_ = (uint)local_1b8.segment;
          decl_00._reader.capTable._4_4_ = local_1b8.capTable._4_4_;
          decl_00._reader.capTable._0_4_ = local_1b8.capTable._0_4_;
          decl_00._reader.pointerCount = local_1b8.pointerCount;
          decl_00._reader.dataSize = local_1b8.dataSize;
          decl_00._reader._38_2_ = local_1b8._38_2_;
          decl_00._reader._44_4_ = local_1b8._44_4_;
          decl_00._reader.nestingLimit = local_1b8.nestingLimit;
          parent_01._reader.capTable = (CapTableReader *)uStack_b8;
          parent_01._reader.segment = (SegmentReader *)local_c0;
          parent_01._reader.data = (void *)local_b0;
          parent_01._reader.pointers = (WirePointer *)uStack_a8;
          parent_01._reader.dataSize = (undefined4)local_a0;
          parent_01._reader.pointerCount = local_a0._4_2_;
          parent_01._reader._38_2_ = local_a0._6_2_;
          parent_01._reader._40_8_ = uStack_98;
          decl_00._reader.data = local_1b8.data;
          decl_00._reader.pointers = local_1b8.pointers;
          newGroupNode(&local_148,this,parent_01,decl_00);
          local_1dc = local_1dc & 0xffffff00;
          parent_02 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                                (local_180,parent,(uint *)&local_1d8,(Reader *)&local_1b8,&local_148
                                 ,(bool *)&local_1dc);
          ppMVar5 = (this->allMembers).builder.pos;
          if (ppMVar5 == (this->allMembers).builder.endPtr) {
            ppMVar3 = (this->allMembers).builder.ptr;
            sVar7 = (long)ppMVar5 - (long)ppMVar3 >> 2;
            if (ppMVar5 == ppMVar3) {
              sVar7 = 4;
            }
            kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                      (local_178,sVar7);
            ppMVar5 = (this->allMembers).builder.pos;
          }
          *ppMVar5 = parent_02;
          pppMVar1 = &(this->allMembers).builder.pos;
          *pppMVar1 = *pppMVar1 + 1;
          local_148.node._builder.data = local_1b8.pointers + 2;
          local_148.node._builder.segment._0_4_ = (uint)local_1b8.segment;
          local_148.node._builder.segment._4_4_ = local_1b8.segment._4_4_;
          uVar10 = local_1b8.capTable._0_4_;
          uVar11 = local_1b8.capTable._4_4_;
          local_148.node._builder.pointers._0_4_ = local_1b8.nestingLimit;
          if (local_1b8.pointerCount < 3) {
            local_148.node._builder.data = (WirePointer *)0x0;
            local_148.node._builder.segment._0_4_ = 0;
            local_148.node._builder.segment._4_4_ = 0;
            uVar10 = 0;
            uVar11 = 0;
            local_148.node._builder.pointers._0_4_ = 0x7fffffff;
          }
          local_148.node._builder.capTable = (CapTableBuilder *)CONCAT44(uVar11,uVar10);
          capnp::_::PointerReader::getList
                    (&local_f0,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
          members_00.reader.capTable = local_f0.capTable;
          members_00.reader.segment = local_f0.segment;
          members_00.reader.ptr = local_f0.ptr;
          members_00.reader.elementCount = local_f0.elementCount;
          members_00.reader.step = local_f0.step;
          members_00.reader.structDataSize = local_f0.structDataSize;
          members_00.reader.structPointerCount = local_f0.structPointerCount;
          members_00.reader.elementSize = local_f0.elementSize;
          members_00.reader._39_1_ = local_f0._39_1_;
          members_00.reader.nestingLimit = local_f0.nestingLimit;
          members_00.reader._44_4_ = local_f0._44_4_;
          traverseGroup(this,members_00,parent_02,local_168);
          LVar8 = local_15c;
        }
        else if (sVar2 == 7) {
          local_150 = kj::Arena::
                      allocate<capnp::compiler::NodeTranslator::StructLayout::Union,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&>
                                (local_180,local_168);
          local_1dc = 0;
          local_1d8.nestingLimit = local_1b8.nestingLimit;
          local_1d8.pointer = local_1b8.pointers;
          if (local_1b8.pointerCount == 0) {
            local_1d8.pointer = (WirePointer *)0x0;
            local_1d8.nestingLimit = 0x7fffffff;
          }
          local_1d8.segment._0_4_ = 0;
          local_1d8.segment._4_4_ = 0;
          local_1d8.capTable._0_4_ = 0;
          local_1d8.capTable._4_4_ = 0;
          if (local_1b8.pointerCount != 0) {
            local_1d8.segment._0_4_ = (uint)local_1b8.segment;
            local_1d8.segment._4_4_ = local_1b8.segment._4_4_;
            local_1d8.capTable._0_4_ = local_1b8.capTable._0_4_;
            local_1d8.capTable._4_4_ = local_1b8.capTable._4_4_;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d8,(word *)0x0);
          local_1d8.pointer =
               (WirePointer *)
               CONCAT44(local_148.node._builder.pointers._4_4_,(int)local_148.node._builder.pointers
                       );
          local_1d8.nestingLimit = (int)local_148.sourceInfo._builder.segment;
          if (local_148.node._builder.pointerCount == 0) {
            local_1d8.pointer = (WirePointer *)0x0;
            local_1d8.nestingLimit = 0x7fffffff;
          }
          local_1d8.segment._0_4_ = 0;
          local_1d8.segment._4_4_ = 0;
          local_1d8.capTable._0_4_ = 0;
          local_1d8.capTable._4_4_ = 0;
          if (local_148.node._builder.pointerCount != 0) {
            local_1d8.segment._0_4_ = (uint)local_148.node._builder.segment;
            local_1d8.segment._4_4_ = local_148.node._builder.segment._4_4_;
            local_1d8.capTable._0_4_ = local_148.node._builder.capTable._0_4_;
            local_1d8.capTable._4_4_ = local_148.node._builder.capTable._4_4_;
          }
          RVar12 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_1d8,(void *)0x0,0);
          pMVar9 = local_170;
          if ((RVar12.super_StringPtr.content.size_ != 1) ||
             (codeOrder_00 = &local_1e4, *RVar12.super_StringPtr.content.ptr != '\0')) {
            local_170->childCount = local_170->childCount + 1;
            local_1d8.segment._0_4_ = local_1e4;
            local_1e4 = local_1e4 + 1;
            capnp::_::StructBuilder::asReader(local_158);
            decl._reader.segment._4_4_ = local_1b8.segment._4_4_;
            decl._reader.segment._0_4_ = (uint)local_1b8.segment;
            decl._reader.capTable._4_4_ = local_1b8.capTable._4_4_;
            decl._reader.capTable._0_4_ = local_1b8.capTable._0_4_;
            decl._reader.pointerCount = local_1b8.pointerCount;
            decl._reader.dataSize = local_1b8.dataSize;
            decl._reader._38_2_ = local_1b8._38_2_;
            decl._reader._44_4_ = local_1b8._44_4_;
            decl._reader.nestingLimit = local_1b8.nestingLimit;
            parent_00._reader.capTable = (CapTableReader *)uStack_58;
            parent_00._reader.segment = (SegmentReader *)local_60;
            parent_00._reader.data = (void *)local_50;
            parent_00._reader.pointers = (WirePointer *)uStack_48;
            parent_00._reader.dataSize = (undefined4)local_40;
            parent_00._reader.pointerCount = local_40._4_2_;
            parent_00._reader._38_2_ = local_40._6_2_;
            parent_00._reader._40_8_ = uStack_38;
            decl._reader.data = local_1b8.data;
            decl._reader.pointers = local_1b8.pointers;
            newGroupNode(&local_148,this,parent_00,decl);
            local_1dd = false;
            parent = kj::Arena::
                     allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructTranslator::NodeSourceInfoBuilderPair,bool>
                               (local_180,pMVar9,(uint *)&local_1d8,(Reader *)&local_1b8,&local_148,
                                &local_1dd);
            ppMVar6 = (this->allMembers).builder.pos;
            if (ppMVar6 == (this->allMembers).builder.endPtr) {
              ppMVar4 = (local_178->builder).ptr;
              sVar7 = (long)ppMVar6 - (long)ppMVar4 >> 2;
              if (ppMVar6 == ppMVar4) {
                sVar7 = 4;
              }
              kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::
              setCapacity(local_178,sVar7);
              ppMVar6 = (this->allMembers).builder.pos;
            }
            *ppMVar6 = parent;
            pppMVar1 = &(this->allMembers).builder.pos;
            *pppMVar1 = *pppMVar1 + 1;
            codeOrder_00 = &local_1dc;
          }
          (parent->field_21).unionScope = local_150;
          local_148.node._builder.data = local_1b8.pointers + 2;
          local_148.node._builder.segment._0_4_ = (uint)local_1b8.segment;
          local_148.node._builder.segment._4_4_ = local_1b8.segment._4_4_;
          uVar10 = local_1b8.capTable._0_4_;
          uVar11 = local_1b8.capTable._4_4_;
          local_148.node._builder.pointers._0_4_ = local_1b8.nestingLimit;
          if (local_1b8.pointerCount < 3) {
            local_148.node._builder.data = (WirePointer *)0x0;
            local_148.node._builder.segment._0_4_ = 0;
            local_148.node._builder.segment._4_4_ = 0;
            uVar10 = 0;
            uVar11 = 0;
            local_148.node._builder.pointers._0_4_ = 0x7fffffff;
          }
          local_148.node._builder.capTable = (CapTableBuilder *)CONCAT44(uVar11,uVar10);
          capnp::_::PointerReader::getList
                    (&local_90,(PointerReader *)&local_148,INLINE_COMPOSITE,(word *)0x0);
          members_01.reader.capTable = local_90.capTable;
          members_01.reader.segment = local_90.segment;
          members_01.reader.ptr = local_90.ptr;
          members_01.reader.elementCount = local_90.elementCount;
          members_01.reader.step = local_90.step;
          members_01.reader.structDataSize = local_90.structDataSize;
          members_01.reader.structPointerCount = local_90.structPointerCount;
          members_01.reader.elementSize = local_90.elementSize;
          members_01.reader._39_1_ = local_90._39_1_;
          members_01.reader.nestingLimit = local_90.nestingLimit;
          members_01.reader._44_4_ = local_90._44_4_;
          traverseUnion(this,(Reader *)&local_1b8,members_01,parent,local_150,codeOrder_00);
          pMVar9 = local_170;
          if ((0xf < local_1b8.dataSize) && (*local_1b8.data == 2)) {
            local_1d8.pointer = local_1b8.pointers + 1;
            local_1d8.segment._0_4_ = (uint)local_1b8.segment;
            local_1d8.segment._4_4_ = local_1b8.segment._4_4_;
            local_1d8.capTable._0_4_ = local_1b8.capTable._0_4_;
            local_1d8.capTable._4_4_ = local_1b8.capTable._4_4_;
            local_1d8.nestingLimit = local_1b8.nestingLimit;
            if (local_1b8.pointerCount < 2) {
              local_1d8.pointer = (WirePointer *)0x0;
              local_1d8.segment._0_4_ = 0;
              local_1d8.segment._4_4_ = 0;
              local_1d8.capTable._0_4_ = 0;
              local_1d8.capTable._4_4_ = 0;
              local_1d8.nestingLimit = 0x7fffffff;
            }
            capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d8,(word *)0x0);
            goto LAB_00138ffe;
          }
        }
        else if (sVar2 == 6) {
          parent->childCount = parent->childCount + 1;
          local_148.node._builder.segment._0_4_ = local_1e4;
          local_1d8.segment._0_4_ = (uint)local_1d8.segment & 0xffffff00;
          local_1e4 = local_1e4 + 1;
          parent = kj::Arena::
                   allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int,capnp::compiler::Declaration::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                             (local_180,parent,(uint *)&local_148,(Reader *)&local_1b8,local_168,
                              (bool *)&local_1d8);
          ppMVar5 = (this->allMembers).builder.pos;
          if (ppMVar5 == (this->allMembers).builder.endPtr) {
            ppMVar3 = (this->allMembers).builder.ptr;
            sVar7 = (long)ppMVar5 - (long)ppMVar3 >> 2;
            if (ppMVar5 == ppMVar3) {
              sVar7 = 4;
            }
            kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                      (local_178,sVar7);
            ppMVar5 = (this->allMembers).builder.pos;
          }
          *ppMVar5 = parent;
          pppMVar1 = &(this->allMembers).builder.pos;
          *pppMVar1 = *pppMVar1 + 1;
          local_1d8.pointer = local_1b8.pointers + 1;
          local_1d8.segment._0_4_ = (uint)local_1b8.segment;
          local_1d8.segment._4_4_ = local_1b8.segment._4_4_;
          local_1d8.capTable._0_4_ = local_1b8.capTable._0_4_;
          local_1d8.capTable._4_4_ = local_1b8.capTable._4_4_;
          local_1d8.nestingLimit = local_1b8.nestingLimit;
          if (local_1b8.pointerCount < 2) {
            local_1d8.segment._0_4_ = 0;
            local_1d8.segment._4_4_ = 0;
            local_1d8.capTable._0_4_ = 0;
            local_1d8.capTable._4_4_ = 0;
            local_1d8.nestingLimit = 0x7fffffff;
            local_1d8.pointer = (WirePointer *)0x0;
          }
          capnp::_::PointerReader::getStruct((StructReader *)&local_148,&local_1d8,(word *)0x0);
LAB_00138ffe:
          local_148.node._builder.segment._0_4_ = 0;
          if (0x3f < local_148.node._builder.dataSize) {
            local_148.node._builder.segment._0_4_ =
                 ((WireValue<uint32_t> *)local_148.node._builder.data)->value;
          }
          local_148.node._builder.capTable = (CapTableBuilder *)parent;
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
          ::
          _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                    (local_f8,(pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>
                               *)&local_148);
          pMVar9 = local_170;
        }
      }
      index = index + 1;
      parent = pMVar9;
    } while (LVar8 != index);
  }
  return;
}

Assistant:

void traverseTopOrGroup(List<Declaration>::Reader members, MemberInfo& parent,
                          StructLayout::StructOrGroup& layout) {
    uint codeOrder = 0;

    for (auto member: members) {
      kj::Maybe<uint> ordinal;
      MemberInfo* memberInfo = nullptr;

      switch (member.which()) {
        case Declaration::FIELD: {
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member, layout, false);
          allMembers.add(memberInfo);
          ordinal = member.getId().getOrdinal().getValue();
          break;
        }

        case Declaration::UNION: {
          StructLayout::Union& unionLayout = arena.allocate<StructLayout::Union>(layout);

          uint independentSubCodeOrder = 0;
          uint* subCodeOrder = &independentSubCodeOrder;
          if (member.getName().getValue() == "") {
            memberInfo = &parent;
            subCodeOrder = &codeOrder;
          } else {
            parent.childCount++;
            memberInfo = &arena.allocate<MemberInfo>(
                parent, codeOrder++, member,
                newGroupNode(parent.node, member),
                false);
            allMembers.add(memberInfo);
          }
          memberInfo->unionScope = &unionLayout;
          traverseUnion(member, member.getNestedDecls(), *memberInfo, unionLayout, *subCodeOrder);
          if (member.getId().isOrdinal()) {
            ordinal = member.getId().getOrdinal().getValue();
          }
          break;
        }

        case Declaration::GROUP:
          parent.childCount++;
          memberInfo = &arena.allocate<MemberInfo>(
              parent, codeOrder++, member,
              newGroupNode(parent.node, member),
              false);
          allMembers.add(memberInfo);

          // Members of the group are laid out just like they were members of the parent, so we
          // just pass along the parent layout.
          traverseGroup(member.getNestedDecls(), *memberInfo, layout);

          // No ordinal for groups.
          break;

        default:
          // Ignore others.
          break;
      }

      KJ_IF_SOME(o, ordinal) {
        membersByOrdinal.insert(std::make_pair(o, memberInfo));
      }
    }
  }